

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::isConvertibleTo(Value *this,ValueType other)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  size_type sVar4;
  double dVar5;
  bool local_60;
  bool local_5f;
  bool local_5e;
  bool local_5d;
  bool local_5c;
  bool local_5b;
  bool local_5a;
  bool local_59;
  string local_40;
  ValueType local_1c;
  Value *pVStack_18;
  ValueType other_local;
  Value *this_local;
  
  local_1c = other;
  pVStack_18 = this;
  switch(other) {
  case nullValue:
    bVar1 = isNumeric(this);
    bVar3 = false;
    if (bVar1) {
      dVar5 = asDouble(this);
      local_59 = true;
      if ((dVar5 != 0.0) || (NAN(dVar5))) goto LAB_007d9c9d;
    }
    else {
LAB_007d9c9d:
      if (((*(ushort *)&this->field_0x8 & 0xff) != 5) ||
         (local_59 = true, ((this->value_).bool_ & 1U) != 0)) {
        if ((*(ushort *)&this->field_0x8 & 0xff) == 4) {
          asString_abi_cxx11_(&local_40,this);
          bVar3 = true;
          bVar2 = std::__cxx11::string::empty();
          local_59 = true;
          if ((bVar2 & 1) != 0) goto LAB_007d9d78;
        }
        if ((*(ushort *)&this->field_0x8 & 0xff) == 6) {
          sVar4 = std::
                  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                  ::size((this->value_).map_);
          local_59 = true;
          if (sVar4 == 0) goto LAB_007d9d78;
        }
        if ((*(ushort *)&this->field_0x8 & 0xff) == 7) {
          sVar4 = std::
                  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                  ::size((this->value_).map_);
          local_59 = true;
          if (sVar4 == 0) goto LAB_007d9d78;
        }
        local_59 = (*(ushort *)&this->field_0x8 & 0xff) == 0;
      }
    }
LAB_007d9d78:
    this_local._7_1_ = local_59;
    if (bVar3) {
      std::__cxx11::string::~string((string *)&local_40);
    }
    break;
  case intValue:
    bVar3 = isInt(this);
    local_5a = true;
    if (!bVar3) {
      if ((*(ushort *)&this->field_0x8 & 0xff) == 3) {
        bVar3 = InRange<int,int>((this->value_).real_,-0x80000000,0x7fffffff);
        local_5a = true;
        if (bVar3) goto LAB_007d9e13;
      }
      local_5a = true;
      if ((*(ushort *)&this->field_0x8 & 0xff) != 5) {
        local_5a = (*(ushort *)&this->field_0x8 & 0xff) == 0;
      }
    }
LAB_007d9e13:
    this_local._7_1_ = local_5a;
    break;
  case uintValue:
    bVar3 = isUInt(this);
    local_5b = true;
    if (!bVar3) {
      if ((*(ushort *)&this->field_0x8 & 0xff) == 3) {
        bVar3 = InRange<int,unsigned_int>((this->value_).real_,0,0xffffffff);
        local_5b = true;
        if (bVar3) goto LAB_007d9e9a;
      }
      local_5b = true;
      if ((*(ushort *)&this->field_0x8 & 0xff) != 5) {
        local_5b = (*(ushort *)&this->field_0x8 & 0xff) == 0;
      }
    }
LAB_007d9e9a:
    this_local._7_1_ = local_5b;
    break;
  case realValue:
    bVar3 = isNumeric(this);
    local_5c = true;
    if ((!bVar3) && (local_5c = true, (*(ushort *)&this->field_0x8 & 0xff) != 5)) {
      local_5c = (*(ushort *)&this->field_0x8 & 0xff) == 0;
    }
    this_local._7_1_ = local_5c;
    break;
  case stringValue:
    bVar3 = isNumeric(this);
    local_5e = true;
    if (((!bVar3) && (local_5e = true, (*(ushort *)&this->field_0x8 & 0xff) != 5)) &&
       (local_5e = true, (*(ushort *)&this->field_0x8 & 0xff) != 4)) {
      local_5e = (*(ushort *)&this->field_0x8 & 0xff) == 0;
    }
    this_local._7_1_ = local_5e;
    break;
  case booleanValue:
    bVar3 = isNumeric(this);
    local_5d = true;
    if ((!bVar3) && (local_5d = true, (*(ushort *)&this->field_0x8 & 0xff) != 5)) {
      local_5d = (*(ushort *)&this->field_0x8 & 0xff) == 0;
    }
    this_local._7_1_ = local_5d;
    break;
  case arrayValue:
    local_5f = true;
    if ((*(ushort *)&this->field_0x8 & 0xff) != 6) {
      local_5f = (*(ushort *)&this->field_0x8 & 0xff) == 0;
    }
    this_local._7_1_ = local_5f;
    break;
  case objectValue:
    local_60 = true;
    if ((*(ushort *)&this->field_0x8 & 0xff) != 7) {
      local_60 = (*(ushort *)&this->field_0x8 & 0xff) == 0;
    }
    this_local._7_1_ = local_60;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                  ,0x3a2,"bool Json::Value::isConvertibleTo(ValueType) const");
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Value::isConvertibleTo(ValueType other) const {
  switch (other) {
  case nullValue:
    return (isNumeric() && asDouble() == 0.0) ||
           (type_ == booleanValue && value_.bool_ == false) ||
           (type_ == stringValue && asString().empty()) ||
           (type_ == arrayValue && value_.map_->size() == 0) ||
           (type_ == objectValue && value_.map_->size() == 0) ||
           type_ == nullValue;
  case intValue:
    return isInt() ||
           (type_ == realValue && InRange(value_.real_, minInt, maxInt)) ||
           type_ == booleanValue || type_ == nullValue;
  case uintValue:
    return isUInt() ||
           (type_ == realValue && InRange(value_.real_, 0, maxUInt)) ||
           type_ == booleanValue || type_ == nullValue;
  case realValue:
    return isNumeric() || type_ == booleanValue || type_ == nullValue;
  case booleanValue:
    return isNumeric() || type_ == booleanValue || type_ == nullValue;
  case stringValue:
    return isNumeric() || type_ == booleanValue || type_ == stringValue ||
           type_ == nullValue;
  case arrayValue:
    return type_ == arrayValue || type_ == nullValue;
  case objectValue:
    return type_ == objectValue || type_ == nullValue;
  }
  JSON_ASSERT_UNREACHABLE;
  return false;
}